

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

SinglyNodeWithRand * __thiscall si9ma::SinglyLinkedList::get_node(SinglyLinkedList *this,int index)

{
  undefined8 *puVar1;
  int local_24;
  SinglyNodeWithRand *pSStack_20;
  int tmp_idx;
  SinglyNodeWithRand *node;
  int index_local;
  SinglyLinkedList *this_local;
  
  if ((-1 < index) && (index < this->size)) {
    pSStack_20 = this->head;
    local_24 = 0;
    while (local_24 < index) {
      pSStack_20 = pSStack_20->next;
      local_24 = local_24 + 1;
    }
    return pSStack_20;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "range overflow";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::get_node(int index) {
        if(index < 0 || index >= size)
            throw "range overflow";

        auto *node = head;
        int tmp_idx = 0;
        while (tmp_idx++ < index)
            node = node->next;

        return node;
    }